

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O0

void __thiscall
randomx::AssemblyGeneratorX86::h_ISWAP_R(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  ostream *poVar1;
  int in_EDX;
  Instruction *in_RSI;
  AssemblyGeneratorX86 *in_RDI;
  
  if (in_RSI->src == in_RSI->dst) {
    tracenop(in_RDI,in_RSI);
  }
  else {
    in_RDI->registerUsage[in_RSI->dst] = in_EDX;
    in_RDI->registerUsage[in_RSI->src] = in_EDX;
    poVar1 = std::operator<<((ostream *)&in_RDI->field_0x10,"\txchg ");
    poVar1 = std::operator<<(poVar1,*(char **)(regR + (ulong)in_RSI->dst * 8));
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::operator<<(poVar1,*(char **)(regR + (ulong)in_RSI->src * 8));
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    traceint(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void AssemblyGeneratorX86::h_ISWAP_R(Instruction& instr, int i) {
		if (instr.src != instr.dst) {
			registerUsage[instr.dst] = i;
			registerUsage[instr.src] = i;
			asmCode << "\txchg " << regR[instr.dst] << ", " << regR[instr.src] << std::endl;
			traceint(instr);
		}
		else {
			tracenop(instr);
		}
	}